

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_nether_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  CHAR_DATA *in_RCX;
  long in_RDX;
  bool saved;
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int iVar5;
  undefined3 in_stack_ffffffffffffff68;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  CHAR_DATA *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  
  uVar6 = CONCAT13(1,in_stack_ffffffffffffff68);
  act(in_stack_ffffffffffffff70,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,uVar6),
      (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
      in_stack_ffffffffffffff58,0);
  act(in_stack_ffffffffffffff70,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,uVar6),
      (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
      in_stack_ffffffffffffff58,0);
  iVar5 = 100;
  iVar2 = *(int *)(in_RDX + 0x158) / 10;
  piVar4 = std::max<int>((int *)&stack0xffffffffffffff64,(int *)&stack0xffffffffffffff60);
  iVar3 = *piVar4;
  bVar1 = saves_spell(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                      CONCAT22(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94));
  if (bVar1) {
    iVar3 = iVar3 / 2;
  }
  else {
    uVar6 = uVar6 & 0xffffff;
  }
  damage_old((CHAR_DATA *)
             CONCAT26(in_stack_ffffffffffffff96,
                      CONCAT24(in_stack_ffffffffffffff94,
                               CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
             (CHAR_DATA *)
             CONCAT26(in_stack_ffffffffffffff8e,
                      CONCAT24(in_stack_ffffffffffffff8c,
                               CONCAT22(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88))),
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
  if ((uVar6 & 0x1000000) == 0) {
    bVar1 = is_affected(in_RCX,(int)gsn_curse);
    if (!bVar1) {
      init_affect((AFFECT_DATA *)0x61d99b);
      std::pow<int,int>(0,0x61da03);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar5,iVar2),in_stack_ffffffffffffff58);
      send_to_char(in_stack_ffffffffffffff70,(CHAR_DATA *)CONCAT44(iVar3,uVar6));
      act(in_stack_ffffffffffffff70,(CHAR_DATA *)CONCAT44(iVar3,uVar6),(void *)CONCAT44(iVar5,iVar2)
          ,in_stack_ffffffffffffff58,0);
    }
  }
  return;
}

Assistant:

void spell_nether_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	int dam;
	bool saved = true;

	act("$n opens $s mouth and unleashes a blast of pure darkness at you!", ch, 0, victim, TO_VICT);
	act("$n opens $s mouth and unleashes a blast of pure darkness at $N!", ch, 0, victim, TO_NOTVICT);

	dam = std::max(100, ch->hit / 10);

	if (saves_spell(level, victim, DAM_NEGATIVE))
		dam /= 2;
	else
		saved = false;

	damage_old(ch, victim, dam, sn, DAM_NEGATIVE, true);

	if (!saved && !is_affected(victim, gsn_curse))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_curse;
		af.aftype = AFT_SPELL;
		af.location = APPLY_SAVES;
		af.modifier = level / 3;
		af.duration = 12;
		af.level = level;
		af.owner = ch;

		SET_BIT(af.bitvector, AFF_CURSE);

		affect_to_char(victim, &af);

		send_to_char("You feel unclean.\n\r", victim);
		act("$n looks very uncomfortable.", victim, 0, 0, TO_ROOM);
	}
}